

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5BufferCompare(Fts5Buffer *pLeft,Fts5Buffer *pRight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = pLeft->n;
  iVar1 = pRight->n;
  iVar2 = iVar1;
  if (iVar3 < iVar1) {
    iVar2 = iVar3;
  }
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = memcmp(pLeft->p,pRight->p,(long)iVar2);
  }
  iVar3 = iVar3 - iVar1;
  if (iVar2 != 0) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

static int fts5BufferCompare(Fts5Buffer *pLeft, Fts5Buffer *pRight){
  int nCmp = MIN(pLeft->n, pRight->n);
  int res = fts5Memcmp(pLeft->p, pRight->p, nCmp);
  return (res==0 ? (pLeft->n - pRight->n) : res);
}